

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  lest local_60 [32];
  result local_40;
  expression_lhs *local_18;
  expression_lhs<const_bool_&> *this_local;
  
  local_40.passed = (bool)(**(byte **)this & 1);
  local_18 = this;
  this_local = (expression_lhs<const_bool_&> *)__return_storage_ptr__;
  to_string<bool>(local_60,*(bool **)this);
  std::__cxx11::string::string((string *)&local_40.decomposition,(string *)local_60);
  result::result(__return_storage_ptr__,&local_40);
  result::~result(&local_40);
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }